

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.h
# Opt level: O1

pair<const_HighsCliqueTable::CliqueVar_*,_int> __thiscall
HighsCliqueTable::findCommonClique(HighsCliqueTable *this,CliqueVar v1,CliqueVar v2)

{
  int iVar1;
  pointer pCVar2;
  HighsInt HVar3;
  pointer pCVar4;
  ulong uVar5;
  pair<const_HighsCliqueTable::CliqueVar_*,_int> pVar6;
  
  if (v1 == v2) {
    return (pair<const_HighsCliqueTable::CliqueVar_*,_int>)ZEXT816(0);
  }
  HVar3 = findCommonCliqueId(this,&this->numNeighbourhoodQueries,v1,v2);
  if (HVar3 == -1) {
    pCVar4 = (pointer)0x0;
    uVar5 = 0;
  }
  else {
    pCVar2 = (this->cliques).
             super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar1 = pCVar2[HVar3].start;
    uVar5 = (ulong)(uint)(pCVar2[HVar3].end - iVar1);
    pCVar4 = (this->cliqueentries).
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar1;
  }
  pVar6._8_8_ = uVar5;
  pVar6.first = pCVar4;
  return pVar6;
}

Assistant:

std::pair<const CliqueVar*, HighsInt> findCommonClique(CliqueVar v1,
                                                         CliqueVar v2) {
    std::pair<const CliqueVar*, HighsInt> c{nullptr, 0};
    if (v1 == v2) return c;
    HighsInt clq = findCommonCliqueId(v1, v2);
    if (clq == -1) return c;

    c.first = &cliqueentries[cliques[clq].start];
    c.second = cliques[clq].end - cliques[clq].start;
    return c;
  }